

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::SobolSampler::Get2D(SobolSampler *this)

{
  undefined1 auVar1 [16];
  int dimension;
  Float FVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar3 [64];
  undefined1 extraout_var [60];
  
  dimension = this->dimension;
  if (0x3fe < dimension) {
    this->dimension = 2;
    dimension = 2;
  }
  FVar2 = SampleDimension(this,dimension);
  auVar3._0_4_ = SampleDimension(this,this->dimension + 1);
  auVar3._4_60_ = extraout_var;
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = FVar2;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  this->dimension = this->dimension + 2;
  auVar1 = vinsertps_avx(auVar1,auVar3._0_16_,0x10);
  return (Point2f)auVar1._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension + 1 >= NSobolDimensions)
            dimension = 2;
        Point2f u(SampleDimension(dimension), SampleDimension(dimension + 1));
        dimension += 2;
        return u;
    }